

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_check_mandatory_tree
              (lyd_node *root,ly_ctx *ctx,lys_module **modules,int mod_count,int options)

{
  lys_module *plVar1;
  int iVar2;
  ulong uVar3;
  lys_node **pplVar4;
  lys_node *plVar5;
  long lVar6;
  char *format;
  ulong uVar7;
  
  if (root == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    __assert_fail("root || ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x354,
                  "int lyd_check_mandatory_tree(struct lyd_node *, struct ly_ctx *, const struct lys_module **, int, int)"
                 );
  }
  if (((uint)options >> 8 & 1) != 0) {
    __assert_fail("!(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x355,
                  "int lyd_check_mandatory_tree(struct lyd_node *, struct ly_ctx *, const struct lys_module **, int, int)"
                 );
  }
  if ((options & 0xeU) != 0) {
    return 0;
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = root->schema->module->ctx;
  }
  if ((options & 0x10000f1U) != 0 && (options & 1U) == 0) {
    if ((options & 0x40U) == 0) {
      if ((options & 0x30U) == 0) {
        if (((uint)options >> 0x18 & 1) == 0) {
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x399);
          return 1;
        }
        goto LAB_0015f396;
      }
      if ((root != (lyd_node *)0x0) &&
         ((root->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN)) {
        pplVar4 = &root->schema->child;
        if ((options & 0x10U) == 0) {
          while( true ) {
            plVar5 = *pplVar4;
            if (plVar5 == (lys_node *)0x0) {
              return 0;
            }
            if (plVar5->nodetype == LYS_OUTPUT) break;
            pplVar4 = &plVar5->next;
          }
        }
        else {
          while( true ) {
            plVar5 = *pplVar4;
            if (plVar5 == (lys_node *)0x0) {
              return 0;
            }
            if (plVar5->nodetype == LYS_INPUT) break;
            pplVar4 = &plVar5->next;
          }
        }
        goto LAB_0015f296;
      }
      format = "Subtree is not a single RPC/action/reply.";
    }
    else {
      if ((root != (lyd_node *)0x0) && (plVar5 = root->schema, plVar5->nodetype == LYS_NOTIF)) {
        if (plVar5->child == (lys_node *)0x0) {
          return 0;
        }
LAB_0015f296:
        iVar2 = lyd_check_mandatory_subtree(root,root,root,plVar5,0,options);
        if (iVar2 == 0) {
          return 0;
        }
        return 1;
      }
      format = "Subtree is not a single notification.";
    }
    ly_log(ctx,LY_LLERR,LY_EINVAL,format);
    return 1;
  }
  if (((uint)options >> 0xc & 1) == 0) {
    if (mod_count == 0 || modules == (lys_module **)0x0) {
      lVar6 = ((ulong)(((uint)options >> 0x10 & 1) != 0) - 1) + (ulong)ctx->internal_module_count;
      do {
        if ((ctx->models).used <= lVar6) {
          return 0;
        }
        plVar1 = (ctx->models).list[lVar6];
        if ((*(ushort *)&plVar1->field_0x40 & 0xc0) == 0x80) {
          pplVar4 = &plVar1->data;
          while (plVar5 = *pplVar4, plVar5 != (lys_node *)0x0) {
            if (((plVar5->nodetype & (LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) &&
               (iVar2 = lyd_check_mandatory_subtree
                                  (root,(lyd_node *)0x0,(lyd_node *)0x0,plVar5,1,options),
               iVar2 != 0)) {
              return 1;
            }
            pplVar4 = &plVar5->next;
          }
        }
        lVar6 = lVar6 + 1;
      } while( true );
    }
    uVar3 = 0;
    uVar7 = (ulong)(uint)mod_count;
    if (mod_count < 1) {
      uVar7 = uVar3;
    }
    do {
      if (uVar3 == uVar7) {
        return 0;
      }
      pplVar4 = &modules[uVar3]->data;
      while (plVar5 = *pplVar4, plVar5 != (lys_node *)0x0) {
        if (((plVar5->nodetype & (LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) &&
           (iVar2 = lyd_check_mandatory_subtree
                              (root,(lyd_node *)0x0,(lyd_node *)0x0,plVar5,1,options), iVar2 != 0))
        {
          return 1;
        }
        pplVar4 = &plVar5->next;
      }
      uVar3 = uVar3 + 1;
    } while( true );
  }
LAB_0015f396:
  if ((root != (lyd_node *)0x0) &&
     (iVar2 = lyd_check_mandatory_subtree
                        (root,(lyd_node *)0x0,(lyd_node *)0x0,root->schema,1,options), iVar2 != 0))
  {
    return 1;
  }
  return 0;
}

Assistant:

int
lyd_check_mandatory_tree(struct lyd_node *root, struct ly_ctx *ctx, const struct lys_module **modules, int mod_count,
                         int options)
{
    struct lys_node *siter;
    int i;

    assert(root || ctx);
    assert(!(options & LYD_OPT_ACT_NOTIF));

    if (options & (LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        /* no check is needed */
        return EXIT_SUCCESS;
    }

    if (!ctx) {
        /* get context */
        ctx = root->schema->module->ctx;
    }

    if (!(options & LYD_OPT_TYPEMASK) || (options & LYD_OPT_CONFIG)) {
        if (options & LYD_OPT_NOSIBLINGS) {
            if (root && lyd_check_mandatory_subtree(root, NULL, NULL, root->schema, 1, options)) {
                return EXIT_FAILURE;
            }
        } else if (modules && mod_count) {
            for (i = 0; i < mod_count; ++i) {
                LY_TREE_FOR(modules[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_RPC | LYS_NOTIF)) &&
                            lyd_check_mandatory_subtree(root, NULL, NULL, siter, 1, options)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        } else {
            for (i = (options & LYD_OPT_DATA_NO_YANGLIB) ? ctx->internal_module_count : ctx->internal_module_count - 1;
                 i < ctx->models.used;
                 i++) {
                /* skip not implemented and disabled modules */
                if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
                    continue;
                }
                LY_TREE_FOR(ctx->models.list[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_RPC | LYS_NOTIF)) &&
                            lyd_check_mandatory_subtree(root, NULL, NULL, siter, 1, options)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        }
    } else if (options & LYD_OPT_NOTIF) {
        if (!root || (root->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single notification.");
            return EXIT_FAILURE;
        }
        if (root->schema->child && lyd_check_mandatory_subtree(root, root, root, root->schema, 0, options)) {
            return EXIT_FAILURE;
        }
    } else if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY)) {
        if (!root || !(root->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single RPC/action/reply.");
            return EXIT_FAILURE;
        }
        if (options & LYD_OPT_RPC) {
            for (siter = root->schema->child; siter && siter->nodetype != LYS_INPUT; siter = siter->next);
        } else { /* LYD_OPT_RPCREPLY */
            for (siter = root->schema->child; siter && siter->nodetype != LYS_OUTPUT; siter = siter->next);
        }
        if (siter && lyd_check_mandatory_subtree(root, root, root, siter, 0, options)) {
            return EXIT_FAILURE;
        }
    } else if (options & LYD_OPT_DATA_TEMPLATE) {
        if (root && lyd_check_mandatory_subtree(root, NULL, NULL, root->schema, 1, options)) {
            return EXIT_FAILURE;
        }
    } else {
        LOGINT(ctx);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}